

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O0

void __thiscall
GrcSymbolTableEntry::CreateFeatAltIDSymbol
          (GrcSymbolTableEntry *this,GrcSymbolTable *psymtbl,GdlFeatureDefn *pfeat,
          GdlStringExpression *pexpString)

{
  GdlFeatureDefn *pfeat_00;
  long in_RCX;
  GrcStructName *in_RDX;
  GrpLineAndFile *in_RSI;
  string staNewSymbol;
  GrpLineAndFile lnf;
  string staValue;
  GdlFeatureDefn *in_stack_fffffffffffffef8;
  GrcSymbolTable *in_stack_ffffffffffffff10;
  GrpLineAndFile *in_stack_ffffffffffffff18;
  GrpLineAndFile *in_stack_ffffffffffffff20;
  string local_b8 [32];
  string local_98 [88];
  string local_40 [32];
  long local_20;
  GrcStructName *local_18;
  GrpLineAndFile *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  GdlStringExpression::StringValue_abi_cxx11_((GdlStringExpression *)in_stack_fffffffffffffef8);
  pfeat_00 = (GdlFeatureDefn *)GdlObject::LineAndFile((GdlObject *)(local_20 + 8));
  GrpLineAndFile::GrpLineAndFile(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::string(local_98);
  GdlFeatureDefn::Name_abi_cxx11_(in_stack_fffffffffffffef8);
  std::__cxx11::string::append(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::append((char *)local_98);
  std::__cxx11::string::append(local_98);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff10,local_98);
  GrcStructName::GrcStructName
            ((GrcStructName *)in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18);
  GrcSymbolTable::AddFeatureAltSymbol(in_stack_ffffffffffffff10,pfeat_00,local_18,local_10);
  GrcStructName::~GrcStructName((GrcStructName *)0x1c86da);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::__cxx11::string::~string(local_98);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1c86fb);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void GrcSymbolTableEntry::CreateFeatAltIDSymbol(GrcSymbolTable * psymtbl, GdlFeatureDefn * pfeat,
	GdlStringExpression * pexpString)
{
	std::string staValue = pexpString->StringValue();
	GrpLineAndFile lnf = pexpString->LineAndFile();
	std::string staNewSymbol;
	staNewSymbol.append(pfeat->Name());
	staNewSymbol.append("__");
	staNewSymbol.append(staValue);
	psymtbl->AddFeatureAltSymbol(pfeat, staNewSymbol, lnf);
}